

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_line.cpp
# Opt level: O0

bool __thiscall ON_Line::Transform(ON_Line *this,ON_Xform *tr)

{
  ON_3dPoint local_48;
  ON_3dPoint local_30;
  ON_Xform *local_18;
  ON_Xform *tr_local;
  ON_Line *this_local;
  
  local_18 = tr;
  tr_local = (ON_Xform *)this;
  ON_Xform::operator*(&local_30,tr,&this->from);
  (this->from).x = local_30.x;
  (this->from).y = local_30.y;
  (this->from).z = local_30.z;
  ON_Xform::operator*(&local_48,local_18,&this->to);
  (this->to).x = local_48.x;
  (this->to).y = local_48.y;
  (this->to).z = local_48.z;
  return true;
}

Assistant:

bool ON_Line::Transform( const ON_Xform& tr )
{
  from = tr*from;
  to = tr*to;
  // 5 June 2003 Dale Lear RR 10493
  //    Always return true.
  //return (from != to) ? true : false;
  return true;
}